

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_token.c
# Opt level: O0

int StringToken_Split(char *source,size_t length,char **delimiters,size_t n_delims,
                     _Bool include_empty,char ***tokens,size_t *token_count)

{
  undefined1 auVar1 [16];
  _Bool _Var2;
  LOGGER_LOG p_Var3;
  STRING_TOKEN_HANDLE token;
  char *__src;
  size_t __n;
  char **ppcVar4;
  char *pcVar5;
  bool bVar6;
  size_t local_e0;
  size_t local_d8;
  ulong local_d0;
  size_t local_c8;
  long local_c0;
  size_t local_b8;
  size_t local_b0;
  LOGGER_LOG l_3;
  size_t malloc_size;
  LOGGER_LOG l_2;
  size_t realloc_size;
  char **temp_token;
  LOGGER_LOG l_1;
  size_t tokenLength;
  char *tokenValue;
  STRING_TOKEN_HANDLE tokenizer;
  LOGGER_LOG l;
  int result;
  char ***tokens_local;
  _Bool include_empty_local;
  size_t n_delims_local;
  char **delimiters_local;
  size_t length_local;
  char *source_local;
  
  if ((((source == (char *)0x0) || (delimiters == (char **)0x0)) || (n_delims == 0)) ||
     ((tokens == (char ***)0x0 || (token_count == (size_t *)0x0)))) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                ,"StringToken_Split",0x130,1,
                "Invalid argument (source=%p, delimiters=%p, n_delims=%lu, tokens=%p, token_count=%p)"
                ,source,delimiters,n_delims,tokens,token_count);
    }
    l._4_4_ = 0x131;
  }
  else {
    token = StringToken_GetFirst(source,length,delimiters,n_delims);
    *token_count = 0;
    *tokens = (char **)0x0;
    l._4_4_ = 0;
    if (token != (STRING_TOKEN_HANDLE)0x0) {
      do {
        __src = StringToken_GetValue(token);
        __n = StringToken_GetLength(token);
        if (((__src != (char *)0x0) && (__n == 0)) || ((__src == (char *)0x0 && (__n != 0)))) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                      ,"StringToken_Split",0x14b,1,"Unexpected token value (%p) or length (%lu)",
                      __src,__n);
          }
          l._4_4_ = 0x14c;
          break;
        }
        if ((__src != (char *)0x0) || (include_empty)) {
          *token_count = *token_count + 1;
          if (*token_count == 0) {
            local_b0 = 0;
          }
          else {
            if (*token_count < 0x2000000000000000) {
              local_b8 = *token_count << 3;
            }
            else {
              local_b8 = 0xffffffffffffffff;
            }
            local_b0 = local_b8;
          }
          if ((local_b0 == 0xffffffffffffffff) ||
             (ppcVar4 = (char **)realloc(*tokens,local_b0), ppcVar4 == (char **)0x0)) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                        ,"StringToken_Split",0x15b,1,
                        "Failed re-allocating the token array, size=%zu",local_b0);
            }
            *token_count = *token_count - 1;
            l._4_4_ = 0x15d;
            break;
          }
          *tokens = ppcVar4;
          if (__n != 0) {
            if (__n < 0xfffffffffffffffe) {
              local_c0 = __n + 1;
            }
            else {
              local_c0 = -1;
            }
            if (local_c0 == 0) {
              local_c8 = 0;
            }
            else {
              if (__n < 0xfffffffffffffffe) {
                local_d0 = __n + 1;
              }
              else {
                local_d0 = 0xffffffffffffffff;
              }
              auVar1._8_8_ = 0;
              auVar1._0_8_ = local_d0;
              if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) == 0) {
                local_e0 = 0xffffffffffffffff;
              }
              else {
                if (__n < 0xfffffffffffffffe) {
                  local_d8 = __n + 1;
                }
                else {
                  local_d8 = 0xffffffffffffffff;
                }
                local_e0 = local_d8;
              }
              local_c8 = local_e0;
            }
            if (local_c8 != 0xffffffffffffffff) {
              pcVar5 = (char *)malloc(local_c8);
              (*tokens)[*token_count - 1] = pcVar5;
              if (pcVar5 != (char *)0x0) {
                memcpy((*tokens)[*token_count - 1],__src,__n);
                (*tokens)[*token_count - 1][__n] = '\0';
                goto LAB_00120c22;
              }
            }
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                        ,"StringToken_Split",0x16c,1,"Failed copying token into array, size=%zu",
                        local_c8);
            }
            *token_count = *token_count - 1;
            l._4_4_ = 0x16e;
            break;
          }
          (*tokens)[*token_count - 1] = (char *)0x0;
        }
LAB_00120c22:
        _Var2 = StringToken_GetNext(token,delimiters,n_delims);
      } while (_Var2);
      StringToken_Destroy(token);
      if (l._4_4_ != 0) {
        while( true ) {
          bVar6 = false;
          if (*token_count != 0) {
            bVar6 = *tokens != (char **)0x0;
          }
          if (!bVar6) break;
          *token_count = *token_count - 1;
          free((*tokens)[*token_count]);
        }
        free(*tokens);
      }
    }
  }
  return l._4_4_;
}

Assistant:

int StringToken_Split(const char* source, size_t length, const char** delimiters, size_t n_delims, bool include_empty, char*** tokens, size_t* token_count)
{
    int result;

    // Codes_SRS_STRING_TOKENIZER_09_022: [ If source, delimiters, token or token_count are NULL, or n_delims is zero the function shall return a non-zero value ]
    if (source == NULL || delimiters == NULL || n_delims == 0 || tokens == NULL || token_count == NULL)
    {
        LogError("Invalid argument (source=%p, delimiters=%p, n_delims=%lu, tokens=%p, token_count=%p)", source, delimiters, (unsigned long)n_delims, tokens, token_count);
        result = MU_FAILURE;
    }
    else
    {
        STRING_TOKEN_HANDLE tokenizer;

        // Codes_SRS_STRING_TOKENIZER_09_023: [ source (up to length) shall be split into individual tokens separated by any of delimiters ]
        tokenizer = StringToken_GetFirst(source, length, delimiters, n_delims);

        *token_count = 0;
        *tokens = NULL;
        // Codes_SRS_STRING_TOKENIZER_09_027: [ If no failures occur the function shall return zero ]
        result = 0;

        if (tokenizer != NULL)
        {
            do
            {
                const char* tokenValue;
                size_t tokenLength;

                tokenValue = StringToken_GetValue(tokenizer);
                tokenLength = StringToken_GetLength(tokenizer);

                if ((tokenValue != NULL && tokenLength == 0) || (tokenValue == NULL && tokenLength > 0))
                {
                    LogError("Unexpected token value (%p) or length (%lu)", tokenValue, (unsigned long)tokenLength);
                    result = MU_FAILURE;
                    break;
                }
                // Codes_SRS_STRING_TOKENIZER_09_024: [ All NULL tokens shall be ommited if include_empty is not TRUE ]
                else if (tokenValue != NULL || include_empty)
                {
                    char** temp_token;
                    // Codes_SRS_STRING_TOKENIZER_09_025: [ The tokens shall be stored in tokens, and their count stored in token_count ]
                    *token_count = (*token_count) + 1;

                    size_t realloc_size = safe_multiply_size_t(sizeof(char*), (*token_count));
                    if (realloc_size == SIZE_MAX ||
                        (temp_token = (char**)realloc(*tokens, realloc_size)) == NULL)
                    {
                        // Codes_SRS_STRING_TOKENIZER_09_026: [ If any failures splitting or storing the tokens occur the function shall return a non-zero value ]
                        LogError("Failed re-allocating the token array, size=%zu", realloc_size);
                        (*token_count)--;
                        result = MU_FAILURE;
                        break;
                    }
                    else
                    {
                        *tokens = temp_token;
                        size_t malloc_size;
                        if (tokenLength == 0)
                        {
                            (*tokens)[(*token_count) - 1] = NULL;
                        }
                        else if ((malloc_size = safe_multiply_size_t(safe_add_size_t(tokenLength, 1), sizeof(char))) == SIZE_MAX ||
                            ((*tokens)[(*token_count) - 1] = (char*)malloc(malloc_size)) == NULL)
                        {
                            // Codes_SRS_STRING_TOKENIZER_09_026: [ If any failures splitting or storing the tokens occur the function shall return a non-zero value ]
                            LogError("Failed copying token into array, size=%zu", malloc_size);
                            *token_count = (*token_count) - 1;
                            result = MU_FAILURE;
                            break;
                        }
                        else
                        {
                            (void)memcpy((*tokens)[(*token_count) - 1], tokenValue, tokenLength);
                            (*tokens)[(*token_count) - 1][tokenLength] = '\0';
                        }
                    }
                }
            } while (StringToken_GetNext(tokenizer, delimiters, n_delims));

            StringToken_Destroy(tokenizer);

            if (result != 0)
            {
                while ((*token_count) > 0 && *tokens != NULL)
                {
                    *token_count = (*token_count) - 1;
                    free((*tokens)[*token_count]);
                }
                free(*tokens);
            }
        }
    }

    return result;
}